

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
MeCab::Param::get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Param *this,char *key)

{
  const_iterator cVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> r;
  allocator local_61;
  key_type local_60;
  size_type *local_40;
  size_type local_38;
  size_type local_30;
  undefined8 uStack_28;
  
  std::__cxx11::string::string((string *)&local_60,key,&local_61);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->conf_)._M_t,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)cVar1._M_node == &(this->conf_)._M_t._M_impl.super__Rb_tree_header) {
    local_60._M_string_length = (size_type)operator_new(0x20);
    *(long **)local_60._M_string_length = (long *)(local_60._M_string_length + 0x10);
    *(long *)(local_60._M_string_length + 8) = 0;
    *(undefined1 *)(local_60._M_string_length + 0x10) = 0;
    local_60._M_dataplus._M_p = (pointer)&PTR__scoped_ptr_0013fdb8;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,(long *)(local_60._M_string_length + 0x10));
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_60);
  }
  else {
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,*(long *)(cVar1._M_node + 2),
               (long)&(cVar1._M_node[2]._M_parent)->_M_color + *(long *)(cVar1._M_node + 2));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_40 == &local_30) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_30;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_28;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_30;
    }
    __return_storage_ptr__->_M_string_length = local_38;
  }
  return __return_storage_ptr__;
}

Assistant:

T get(const char *key) const {
    std::map<std::string, std::string>::const_iterator it = conf_.find(key);
    if (it == conf_.end()) {
      scoped_ptr<T> r(new T());
      return *r;
    }
    return lexical_cast<T, std::string>(it->second);
  }